

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O3

int32_t __thiscall DebugInfo::GetObjectFileIndex(DebugInfo *this,char *pathStr)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  long lVar2;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  _Rb_tree_color _Var3;
  string file;
  string dir;
  string path;
  ObjectFileInfo info;
  _Alloc_node __an;
  key_type local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  key_type local_d8;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  uint32_t local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_60;
  _Alloc_node local_38;
  
  std::__cxx11::string::string((string *)&local_d8,pathStr,(allocator *)local_b8);
  this_00 = &this->m_ObjectPathToIndex;
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this_00->_M_t,&local_d8);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->m_ObjectPathToIndex)._M_t._M_impl.super__Rb_tree_header) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    lVar2 = std::__cxx11::string::find_last_of((char *)&local_d8,0x1102cc,0xffffffffffffffff);
    if (lVar2 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_f8,0,(char *)local_f8._M_string_length,0x11006f);
      std::__cxx11::string::_M_assign((string *)&local_118);
    }
    else {
      std::__cxx11::string::substr((ulong)local_b8,(ulong)&local_d8);
      std::__cxx11::string::operator=((string *)&local_f8,(string *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
      }
      std::__cxx11::string::substr((ulong)local_b8,(ulong)&local_d8);
      std::__cxx11::string::operator=((string *)&local_118,(string *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
      }
    }
    local_b8._0_8_ = local_b8 + 0x10;
    local_b8._8_8_ = 0;
    local_b8[0x10] = '\0';
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    local_68 = 0;
    local_98._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_assign((string *)local_b8);
    std::__cxx11::string::_M_assign((string *)&local_98);
    _Var3 = (_Rb_tree_color)
            (this->m_ObjectPathToIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_78._0_4_ = _Var3;
    std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>::emplace_back<ObjectFileInfo&>
              ((vector<ObjectFileInfo,std::allocator<ObjectFileInfo>> *)&this->m_ObjectFiles,
               (ObjectFileInfo *)local_b8);
    paVar1 = &local_60.first.field_2;
    local_60.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    local_60.second = _Var3;
    local_38._M_t = &this_00->_M_t;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::
    _M_insert_unique_<std::pair<std::__cxx11::string_const,int>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>::_Alloc_node>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)this_00,(const_iterator)__position._M_node,&local_60,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&this->m_ObjectNameToFolders,&local_118);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(this_01,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,
                      CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    _Var3 = __position._M_node[2]._M_color;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return _Var3;
}

Assistant:

int32_t DebugInfo::GetObjectFileIndex(const char* pathStr)
{
    std::string path = pathStr;
    auto it = m_ObjectPathToIndex.find(path);
    if (it != m_ObjectPathToIndex.end())
        return it->second;

    std::string dir, file;
    splitPath(path, dir, file);

    ObjectFileInfo info;
    info.fileDir = dir;
    info.fileName = file;

    int32_t index = int32_t(m_ObjectPathToIndex.size());
    info.index = index;

    m_ObjectFiles.emplace_back(info);
    m_ObjectPathToIndex.insert(it, {path, index});
    m_ObjectNameToFolders[file].insert(dir);
    return index;
}